

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowAggregateExecutor::Sink
          (WindowAggregateExecutor *this,DataChunk *sink_chunk,DataChunk *coll_chunk,idx_t input_idx
          ,WindowExecutorGlobalState *gstate,WindowExecutorLocalState *lstate)

{
  type pWVar1;
  type pWVar2;
  pointer pWVar3;
  idx_t local_50;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_48;
  
  if (gstate[1].executor == (WindowExecutor *)0x0) {
    local_48 = (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               0x0;
    local_50 = 0;
  }
  else {
    local_48 = &lstate[0x16].range_cursor;
    local_50 = ExpressionExecutor::SelectExpression
                         ((ExpressionExecutor *)(lstate + 0x12),sink_chunk,
                          (SelectionVector *)local_48);
  }
  pWVar1 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)(gstate + 1));
  pWVar2 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)&lstate[0x11].range_cursor);
  pWVar3 = unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>,_true>
           ::operator->(&this->aggregator);
  (*pWVar3->_vptr_WindowAggregator[4])
            (pWVar3,pWVar1,pWVar2,sink_chunk,coll_chunk,input_idx,local_48,local_50);
  (*(lstate->super_WindowExecutorState)._vptr_WindowExecutorState[2])
            (lstate,gstate,sink_chunk,coll_chunk,input_idx);
  return;
}

Assistant:

void WindowAggregateExecutor::Sink(DataChunk &sink_chunk, DataChunk &coll_chunk, const idx_t input_idx,
                                   WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate) const {
	auto &gastate = gstate.Cast<WindowAggregateExecutorGlobalState>();
	auto &lastate = lstate.Cast<WindowAggregateExecutorLocalState>();
	auto &filter_sel = lastate.filter_sel;
	auto &filter_executor = lastate.filter_executor;

	idx_t filtered = 0;
	SelectionVector *filtering = nullptr;
	if (gastate.filter_ref) {
		filtering = &filter_sel;
		filtered = filter_executor.SelectExpression(sink_chunk, filter_sel);
	}

	D_ASSERT(aggregator);
	auto &gestate = *gastate.gsink;
	auto &lestate = *lastate.aggregator_state;
	aggregator->Sink(gestate, lestate, sink_chunk, coll_chunk, input_idx, filtering, filtered);

	WindowExecutor::Sink(sink_chunk, coll_chunk, input_idx, gstate, lstate);
}